

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O0

offset_in_this_suite_class_to_subr
agge::tests::LayoutTests::__SingleLineUnboundLayoutProducesSingleGlyphRuns_meta(char **name)

{
  char **name_local;
  
  *name = "SingleLineUnboundLayoutProducesSingleGlyphRuns";
  return (offset_in_this_suite_class_to_subr)SingleLineUnboundLayoutProducesSingleGlyphRuns;
}

Assistant:

test( SingleLineUnboundLayoutProducesSingleGlyphRuns )
			{
				// INIT
				mocks::font_accessor::char_to_index indices1[] = { { L'A', 1 }, { L'B', 0 }, { L'Q', 0 }, };
				mocks::font_accessor::char_to_index indices2[] = { { L'A', 0 }, { L'B', 1 }, { L'Q', 2 }, { L' ', 3 } };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 13, 0 } },
					{ { 11, 0 } },
					{ { 12.7, 0 } },
					{ { 10.1, 0 } },
				};
				factory_ptr f1 = create_single_font_factory(c_fm1, indices1, glyphs);
				factory_ptr f2 = create_single_font_factory(c_fm2, indices2, glyphs);
				layout::const_iterator gr;

				// INIT / ACT
				layout l1;
				layout l2;
				layout l3;
				layout l4;
				layout l5;

				l1.process(R("A"), limit::none(), *f1);
				l2.process(R("AAB"), limit::none(), *f1);
				l3.process(R("BQA"), limit::none(), *f1);
				l4.process(R("A"), limit::none(), *f2);
				l5.process(R("ABQ A  QA"), limit::none(), *f2);

				// ASSERT
				positioned_glyph reference1[] = { { 1, { 11.0f, 0.0f } } };
				positioned_glyph reference2[] = { { 1, { 11.0f, 0.0f } }, { 1, { 11.0f, 0.0f } }, { 0, { 13.0f, 0.0f } }, };
				positioned_glyph reference3[] = { { 0, { 13.0f, 0.0f } }, { 0, { 13.0f, 0.0f } }, { 1, { 11.0f, 0.0f } }, };
				positioned_glyph reference4[] = { { 0, { 13.0f, 0.0f } }, };
				positioned_glyph reference5[] = {
					{ 0, { 13.0f, 0.0f } },
					{ 1, { 11.0f, 0.0f } },
					{ 2, { 12.7f, 0.0f } },
					{ 3, { 10.1f, 0.0f } },
					{ 0, { 13.0f, 0.0f } },
					{ 3, { 10.1f, 0.0f } },
					{ 3, { 10.1f, 0.0f } },
					{ 2, { 12.7f, 0.0f } },
					{ 0, { 13.0f, 0.0f } },
				};

				assert_equal(plural + ref_text_line(0.0f, 10.0f, 0.0f, plural + ref_glyph_run(**f1, 0.0f, 0.0f, reference1)),
					mkvector(l1.begin(), l1.end()));

				assert_equal(plural + ref_text_line(0.0f, 10.0f, 0.0f, plural + ref_glyph_run(**f1, 0.0f, 0.0f, reference2)),
					mkvector(l2.begin(), l2.end()));

				assert_equal(plural + ref_text_line(0.0f, 10.0f, 0.0f, plural + ref_glyph_run(**f1, 0.0f, 0.0f, reference3)),
					mkvector(l3.begin(), l3.end()));

				assert_equal(plural + ref_text_line(0.0f, 14.0f, 0.0f, plural + ref_glyph_run(**f2, 0.0f, 0.0f, reference4)),
					mkvector(l4.begin(), l4.end()));

				assert_equal(plural + ref_text_line(0.0f, 14.0f, 0.0f, plural + ref_glyph_run(**f2, 0.0f, 0.0f, reference5)),
					mkvector(l5.begin(), l5.end()));
			}